

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editline.c
# Opt level: O0

el_status_t move_to_char(void)

{
  int iVar1;
  char *local_20;
  char *p;
  int local_10;
  int c;
  int i;
  
  iVar1 = tty_get();
  if (iVar1 == -1) {
    c = 1;
  }
  else {
    local_10 = rl_point + 1;
    local_20 = rl_line_buffer + local_10;
    for (; local_10 < rl_end; local_10 = local_10 + 1) {
      if (*local_20 == iVar1) {
        rl_point = local_10;
        return CSmove;
      }
      local_20 = local_20 + 1;
    }
    c = 4;
  }
  return c;
}

Assistant:

static el_status_t move_to_char(void)
{
    int i, c;
    char *p;

    if ((c = tty_get()) == EOF)
        return CSeof;

    for (i = rl_point + 1, p = &rl_line_buffer[i]; i < rl_end; i++, p++) {
        if (*p == c) {
            rl_point = i;
            return CSmove;
        }
    }

    return CSstay;
}